

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphbuilderadapter.cpp
# Opt level: O0

void __thiscall YAML::GraphBuilderAdapter::DispositionNode(GraphBuilderAdapter *this,void *pNode)

{
  void *pvVar1;
  bool bVar2;
  reference pvVar3;
  undefined8 in_RSI;
  long in_RDI;
  void *pContainer;
  
  bVar2 = std::
          stack<YAML::GraphBuilderAdapter::ContainerFrame,_std::deque<YAML::GraphBuilderAdapter::ContainerFrame,_std::allocator<YAML::GraphBuilderAdapter::ContainerFrame>_>_>
          ::empty((stack<YAML::GraphBuilderAdapter::ContainerFrame,_std::deque<YAML::GraphBuilderAdapter::ContainerFrame,_std::allocator<YAML::GraphBuilderAdapter::ContainerFrame>_>_>
                   *)0xef1d41);
  if (bVar2) {
    *(undefined8 *)(in_RDI + 0x78) = in_RSI;
  }
  else {
    pvVar3 = std::
             stack<YAML::GraphBuilderAdapter::ContainerFrame,_std::deque<YAML::GraphBuilderAdapter::ContainerFrame,_std::allocator<YAML::GraphBuilderAdapter::ContainerFrame>_>_>
             ::top((stack<YAML::GraphBuilderAdapter::ContainerFrame,_std::deque<YAML::GraphBuilderAdapter::ContainerFrame,_std::allocator<YAML::GraphBuilderAdapter::ContainerFrame>_>_>
                    *)0xef1d68);
    pvVar1 = pvVar3->pContainer;
    pvVar3 = std::
             stack<YAML::GraphBuilderAdapter::ContainerFrame,_std::deque<YAML::GraphBuilderAdapter::ContainerFrame,_std::allocator<YAML::GraphBuilderAdapter::ContainerFrame>_>_>
             ::top((stack<YAML::GraphBuilderAdapter::ContainerFrame,_std::deque<YAML::GraphBuilderAdapter::ContainerFrame,_std::allocator<YAML::GraphBuilderAdapter::ContainerFrame>_>_>
                    *)0xef1d7e);
    bVar2 = ContainerFrame::isMap(pvVar3);
    if (bVar2) {
      if (*(long *)(in_RDI + 0x80) == 0) {
        *(undefined8 *)(in_RDI + 0x80) = in_RSI;
      }
      else {
        (**(code **)(**(long **)(in_RDI + 8) + 0x40))
                  (*(long **)(in_RDI + 8),pvVar1,*(undefined8 *)(in_RDI + 0x80),in_RSI);
        *(undefined8 *)(in_RDI + 0x80) = 0;
      }
    }
    else {
      (**(code **)(**(long **)(in_RDI + 8) + 0x28))(*(long **)(in_RDI + 8),pvVar1,in_RSI);
    }
  }
  return;
}

Assistant:

void GraphBuilderAdapter::DispositionNode(void *pNode) {
  if (m_containers.empty()) {
    m_pRootNode = pNode;
    return;
  }

  void *pContainer = m_containers.top().pContainer;
  if (m_containers.top().isMap()) {
    if (m_pKeyNode) {
      m_builder.AssignInMap(pContainer, m_pKeyNode, pNode);
      m_pKeyNode = nullptr;
    } else {
      m_pKeyNode = pNode;
    }
  } else {
    m_builder.AppendToSequence(pContainer, pNode);
  }
}